

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O1

SimpleString __thiscall
SimpleString::subStringFromTill(SimpleString *this,char startChar,char lastExcludedChar)

{
  char *pcVar1;
  long lVar2;
  ulong uVar3;
  char in_CL;
  size_t amount;
  size_t extraout_RDX;
  undefined7 in_register_00000031;
  size_t n;
  size_t sVar4;
  ulong uVar5;
  size_t sVar6;
  SimpleString SVar7;
  
  lVar2 = *(long *)CONCAT71(in_register_00000031,startChar);
  sVar4 = 0xffffffffffffffff;
  do {
    pcVar1 = (char *)(lVar2 + 1 + sVar4);
    sVar4 = sVar4 + 1;
  } while (*pcVar1 != '\0');
  amount = 0xffffffffffffffff;
  if (sVar4 != 0) {
    sVar6 = 0;
    do {
      amount = sVar6;
      if (*(char *)(lVar2 + sVar6) == lastExcludedChar) break;
      sVar6 = sVar6 + 1;
      amount = 0xffffffffffffffff;
    } while (sVar4 != sVar6);
  }
  if (amount == 0xffffffffffffffff) {
    this->buffer_ = (char *)0x0;
    this->bufferSize_ = 0;
    copyBufferToNewInternalBuffer(this,"");
    sVar4 = extraout_RDX;
  }
  else {
    uVar5 = 0xffffffffffffffff;
    do {
      pcVar1 = (char *)(lVar2 + 1 + uVar5);
      uVar5 = uVar5 + 1;
      uVar3 = amount;
    } while (*pcVar1 != '\0');
    for (; (uVar3 < uVar5 && (*(char *)(lVar2 + uVar3) != in_CL)); uVar3 = uVar3 + 1) {
    }
    SVar7 = subString(this,(size_t)CONCAT71(in_register_00000031,startChar),amount);
    sVar4 = SVar7.bufferSize_;
  }
  SVar7.bufferSize_ = sVar4;
  SVar7.buffer_ = (char *)this;
  return SVar7;
}

Assistant:

SimpleString SimpleString::subStringFromTill(char startChar, char lastExcludedChar) const
{
    size_t beginPos = find(startChar);
    if (beginPos == npos) return "";

    size_t endPos = findFrom(beginPos, lastExcludedChar);
    if (endPos == npos) return subString(beginPos);

    return subString(beginPos, endPos - beginPos);
}